

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocument.cpp
# Opt level: O3

LazyObject * __thiscall Assimp::FBX::Connection::LazyDestinationObject(Connection *this)

{
  ulong uVar1;
  _Rb_tree_header *p_Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  
  p_Var4 = (this->doc->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var4 != (_Base_ptr)0x0) {
    uVar1 = this->dest;
    p_Var2 = &(this->doc->objects)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = &p_Var2->_M_header;
    do {
      if (*(ulong *)(p_Var4 + 1) >= uVar1) {
        p_Var3 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[*(ulong *)(p_Var4 + 1) < uVar1];
    } while (p_Var4 != (_Base_ptr)0x0);
    if ((((_Rb_tree_header *)p_Var3 != p_Var2) && (*(ulong *)(p_Var3 + 1) <= uVar1)) &&
       ((LazyObject *)p_Var3[1]._M_parent != (LazyObject *)0x0)) {
      return (LazyObject *)p_Var3[1]._M_parent;
    }
  }
  __assert_fail("lazy",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/FBX/FBXDocument.cpp"
                ,0x2b7,"LazyObject &Assimp::FBX::Connection::LazyDestinationObject() const");
}

Assistant:

LazyObject& Connection::LazyDestinationObject() const
{
    LazyObject* const lazy = doc.GetObject(dest);
    ai_assert(lazy);
    return *lazy;
}